

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue js_regexp_Symbol_match(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  JSShape *sh;
  int iVar1;
  int iVar2;
  JSRefCountHeader *p_1;
  JSValueUnion p;
  JSValueUnion JVar3;
  ulong uVar4;
  JSValueUnion JVar5;
  int64_t iVar6;
  JSRefCountHeader *p_4;
  ulong uVar7;
  uint uVar8;
  bool bVar9;
  JSValue JVar10;
  JSValue JVar11;
  JSValue v;
  JSValue JVar12;
  int64_t thisIndex;
  uint local_60;
  int64_t local_58;
  JSValueUnion local_50;
  int64_t local_38;
  
  if ((int)this_val.tag == -1) {
    JVar10 = JS_ToStringInternal(ctx,*argv,0);
    p = JVar10.u;
    uVar8 = (uint)JVar10.tag;
    if (uVar8 != 6) {
      JVar11 = JS_GetPropertyInternal(ctx,this_val,0x6e,this_val,0);
      iVar1 = JS_ToBoolFree(ctx,JVar11);
      if (-1 < iVar1) {
        if (iVar1 == 0) {
          JVar11 = JS_RegExpExec(ctx,this_val,JVar10);
          uVar7 = (ulong)JVar11.u.ptr & 0xffffffff00000000;
LAB_0013f4dd:
          iVar6 = JVar11.tag;
          if ((0xfffffff4 < uVar8) && (iVar1 = *p.ptr, *(int *)p.ptr = iVar1 + -1, iVar1 < 2)) {
            __JS_FreeValueRT(ctx->rt,JVar10);
          }
          uVar4 = (ulong)JVar11.u.ptr & 0xffffffff;
          goto LAB_0013f772;
        }
        JVar11 = JS_GetPropertyInternal(ctx,this_val,0x6f,this_val,0);
        iVar1 = JS_ToBoolFree(ctx,JVar11);
        if ((-1 < iVar1) &&
           (iVar2 = JS_SetPropertyInternal(ctx,this_val,0x55,(JSValue)ZEXT816(0),0x4000), -1 < iVar2
           )) {
          sh = ctx->array_shape;
          (sh->header).ref_count = (sh->header).ref_count + 1;
          JVar11 = JS_NewObjectFromShape(ctx,sh,2);
          JVar3 = JVar11.u;
          local_60 = (uint)JVar11.tag;
          if (local_60 != 6) {
            uVar7 = (ulong)JVar3.ptr & 0xffffffff00000000;
            local_58 = 0;
            v = (JSValue)(ZEXT816(3) << 0x40);
            do {
              if ((0xfffffff4 < (uint)v.tag) &&
                 (iVar2 = *v.u.ptr, *(int *)v.u.ptr = iVar2 + -1, iVar2 < 2)) {
                __JS_FreeValueRT(ctx->rt,v);
              }
              v = JS_RegExpExec(ctx,this_val,JVar10);
              if ((int)v.tag == 2) {
                if (local_58 == 0) {
                  if ((0xfffffff4 < local_60) &&
                     (iVar1 = *JVar3.ptr, *(int *)JVar3.ptr = iVar1 + -1, iVar1 < 2)) {
                    __JS_FreeValueRT(ctx->rt,JVar11);
                  }
                  uVar7 = 0;
                  JVar11 = (JSValue)(ZEXT816(2) << 0x40);
                }
                goto LAB_0013f4dd;
              }
              if ((int)v.tag == 6) goto LAB_0013f6fd;
              JVar12 = JS_GetPropertyValue(ctx,v,(JSValue)ZEXT816(0));
              JVar12 = JS_ToStringFree(ctx,JVar12);
              if ((int)JVar12.tag == -7) {
                uVar4 = *(ulong *)((long)JVar12.u.ptr + 4);
                iVar2 = JS_SetPropertyInt64(ctx,JVar11,local_58,JVar12);
                if (iVar2 < 0) goto LAB_0013f6fd;
                if ((uVar4 & 0x7fffffff) == 0) {
                  JVar12 = JS_GetPropertyInternal(ctx,this_val,0x55,this_val,0);
                  iVar2 = JS_ToLengthFree(ctx,&local_38,JVar12);
                  if (-1 < iVar2) {
                    uVar4 = string_advance_index((JSString *)p.ptr,local_38,iVar1);
                    bVar9 = (long)(int)uVar4 == uVar4;
                    JVar5.float64 = (double)(long)uVar4;
                    if (bVar9) {
                      JVar5.ptr = (void *)(uVar4 & 0xffffffff);
                    }
                    iVar6 = 7;
                    if (bVar9) {
                      iVar6 = 0;
                    }
                    JVar12.tag = iVar6;
                    JVar12.u.float64 = JVar5.float64;
                    iVar2 = JS_SetPropertyInternal(ctx,this_val,0x55,JVar12,0x4000);
                    goto LAB_0013f6aa;
                  }
                  goto LAB_0013f6fd;
                }
              }
              else {
                if ((int)JVar12.tag == 6) goto LAB_0013f6fd;
                iVar2 = JS_SetPropertyInt64(ctx,JVar11,local_58,JVar12);
LAB_0013f6aa:
                if (iVar2 < 0) goto LAB_0013f6fd;
              }
              local_58 = local_58 + 1;
            } while( true );
          }
          v = (JSValue)(ZEXT816(3) << 0x40);
LAB_0013f6fd:
          local_50 = v.u;
          if ((0xfffffff4 < local_60) &&
             (iVar1 = *JVar3.ptr, *(int *)JVar3.ptr = iVar1 + -1, iVar1 < 2)) {
            __JS_FreeValueRT(ctx->rt,JVar11);
          }
          if ((0xfffffff4 < (uint)v.tag) &&
             (iVar1 = *local_50.ptr, *(int *)local_50.ptr = iVar1 + -1, iVar1 < 2)) {
            __JS_FreeValueRT(ctx->rt,v);
          }
        }
      }
    }
    if ((0xfffffff4 < uVar8) && (iVar1 = *p.ptr, *(int *)p.ptr = iVar1 + -1, iVar1 < 2)) {
      __JS_FreeValueRT(ctx->rt,JVar10);
    }
  }
  else {
    JS_ThrowTypeError(ctx,"not an object");
  }
  uVar4 = 0;
  iVar6 = 6;
  uVar7 = 0;
LAB_0013f772:
  JVar10.tag = iVar6;
  JVar10.u.ptr = (void *)(uVar4 | uVar7);
  return JVar10;
}

Assistant:

static JSValue js_regexp_Symbol_match(JSContext *ctx, JSValueConst this_val,
                                      int argc, JSValueConst *argv)
{
    // [Symbol.match](str)
    JSValueConst rx = this_val;
    JSValue A, S, result, matchStr;
    int global, n, fullUnicode, isEmpty;
    JSString *p;

    if (!JS_IsObject(rx))
        return JS_ThrowTypeErrorNotAnObject(ctx);

    A = JS_UNDEFINED;
    result = JS_UNDEFINED;
    matchStr = JS_UNDEFINED;
    S = JS_ToString(ctx, argv[0]);
    if (JS_IsException(S))
        goto exception;

    global = JS_ToBoolFree(ctx, JS_GetProperty(ctx, rx, JS_ATOM_global));
    if (global < 0)
        goto exception;

    if (!global) {
        A = JS_RegExpExec(ctx, rx, S);
    } else {
        fullUnicode = JS_ToBoolFree(ctx, JS_GetProperty(ctx, rx, JS_ATOM_unicode));
        if (fullUnicode < 0)
            goto exception;

        if (JS_SetProperty(ctx, rx, JS_ATOM_lastIndex, JS_NewInt32(ctx, 0)) < 0)
            goto exception;
        A = JS_NewArray(ctx);
        if (JS_IsException(A))
            goto exception;
        n = 0;
        for(;;) {
            JS_FreeValue(ctx, result);
            result = JS_RegExpExec(ctx, rx, S);
            if (JS_IsException(result))
                goto exception;
            if (JS_IsNull(result))
                break;
            matchStr = JS_ToStringFree(ctx, JS_GetPropertyInt64(ctx, result, 0));
            if (JS_IsException(matchStr))
                goto exception;
            isEmpty = JS_IsEmptyString(matchStr);
            if (JS_SetPropertyInt64(ctx, A, n++, matchStr) < 0)
                goto exception;
            if (isEmpty) {
                int64_t thisIndex, nextIndex;
                if (JS_ToLengthFree(ctx, &thisIndex,
                                    JS_GetProperty(ctx, rx, JS_ATOM_lastIndex)) < 0)
                    goto exception;
                p = JS_VALUE_GET_STRING(S);
                nextIndex = string_advance_index(p, thisIndex, fullUnicode);
                if (JS_SetProperty(ctx, rx, JS_ATOM_lastIndex, JS_NewInt64(ctx, nextIndex)) < 0)
                    goto exception;
            }
        }
        if (n == 0) {
            JS_FreeValue(ctx, A);
            A = JS_NULL;
        }
    }
    JS_FreeValue(ctx, result);
    JS_FreeValue(ctx, S);
    return A;

exception:
    JS_FreeValue(ctx, A);
    JS_FreeValue(ctx, result);
    JS_FreeValue(ctx, S);
    return JS_EXCEPTION;
}